

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

void ggml_graph_reset(ggml_cgraph *cgraph)

{
  ggml_tensor *node;
  ggml_tensor *tensor;
  char *pcVar1;
  int line;
  long lVar2;
  float onef;
  undefined4 local_2c;
  
  if (cgraph->grads == (ggml_tensor **)0x0) {
    pcVar1 = "cgraph->grads != NULL";
    line = 0x17bc;
LAB_00122581:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
               "GGML_ASSERT(%s) failed",pcVar1);
  }
  if (0 < cgraph->n_nodes) {
    lVar2 = 0;
    do {
      node = cgraph->nodes[lVar2];
      tensor = ggml_graph_get_grad_acc(cgraph,node);
      if (node->op == GGML_OP_OPT_STEP_ADAMW) {
        ggml_set_zero(node->src[2]);
        ggml_set_zero(node->src[3]);
      }
      if (tensor != (ggml_tensor *)0x0) {
        if ((node->flags & 8) == 0) {
          ggml_set_zero(tensor);
        }
        else {
          if (tensor->type != GGML_TYPE_F32) {
            pcVar1 = "grad_acc->type == GGML_TYPE_F32";
            line = 0x17cb;
            goto LAB_00122581;
          }
          if ((((tensor->ne[0] != 1) || (tensor->ne[1] != 1)) || (tensor->ne[2] != 1)) ||
             (tensor->ne[3] != 1)) {
            pcVar1 = "ggml_is_scalar(grad_acc)";
            line = 0x17cc;
            goto LAB_00122581;
          }
          local_2c = 0x3f800000;
          if (tensor->buffer == (ggml_backend_buffer *)0x0) {
            if ((undefined4 *)tensor->data == (undefined4 *)0x0) {
              pcVar1 = "grad_acc->data";
              line = 0x17d2;
              goto LAB_00122581;
            }
            *(undefined4 *)tensor->data = 0x3f800000;
          }
          else {
            ggml_backend_tensor_set(tensor,&local_2c,0,4);
          }
        }
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < cgraph->n_nodes);
  }
  return;
}

Assistant:

void ggml_graph_reset(struct ggml_cgraph * cgraph) {
    GGML_ASSERT(cgraph->grads != NULL);

    for (int i = 0; i < cgraph->n_nodes; i++) {
        struct ggml_tensor * node     = cgraph->nodes[i];
        struct ggml_tensor * grad_acc = ggml_graph_get_grad_acc(cgraph, node);

        if (node->op == GGML_OP_OPT_STEP_ADAMW) {
            // clear momenta
            ggml_set_zero(node->src[2]);
            ggml_set_zero(node->src[3]);
        }

        // initial gradients of loss should be 1, 0 otherwise
        if (grad_acc) {
            if (node->flags & GGML_TENSOR_FLAG_LOSS) {
                GGML_ASSERT(grad_acc->type == GGML_TYPE_F32);
                GGML_ASSERT(ggml_is_scalar(grad_acc));

                const float onef = 1.0f;
                if (grad_acc->buffer) {
                    ggml_backend_tensor_set(grad_acc, &onef, 0, sizeof(float));
                } else {
                    GGML_ASSERT(grad_acc->data);
                    *((float *) grad_acc->data) = onef;
                }
            } else {
                ggml_set_zero(grad_acc);
            }
        }
    }
}